

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epc18_2.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinEPC18_2>::eval_exc_vxc_unpolar_impl
               (double rho,double *eps,double *vrho)

{
  double *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double t32;
  double t27;
  double t23;
  double t22;
  double t18;
  double t17;
  double t14;
  double t13;
  double t10;
  double t9;
  double t8;
  double t7;
  double t6;
  double t4;
  double t3;
  double t2;
  
  dVar1 = (double)(-(ulong)(in_XMM0_Qa * 0.5 <= 1e-24) & 0x3ff0000000000000);
  piecewise_functor_5<double>(false,-0.999999999999999,false,0.999999999999999,0.0);
  dVar2 = (in_XMM0_Qa * in_XMM0_Qa * 0.96 - (in_XMM0_Qa + in_XMM0_Qa)) + 3.9;
  dVar3 = piecewise_functor_3<double>
                    (dVar1 != 0.0,0.0,
                     (in_XMM0_Qa * 1.0 * (1.0 / (dVar2 * dVar2)) * (in_XMM0_Qa * 1.92 + -2.0)) / 4.0
                     - ((1.0 / dVar2) * 1.0) / 4.0);
  dVar1 = piecewise_functor_3<double>(dVar1 != 0.0,0.0,(-(in_XMM0_Qa * 1.0) * (1.0 / dVar2)) / 4.0);
  *in_RDI = dVar1;
  *in_RSI = in_XMM0_Qa * dVar3 + *in_RDI;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_unpolar_impl( double rho, double& eps, double& vrho ) {



    const double t2 = rho / 0.2e1 <= dens_tol;
    const double t3 = 0.1e1 <= zeta_tol;
    const double t4 = zeta_tol - 0.1e1;
    const double t6 = piecewise_functor_5( t3, t4, t3, -t4, 0.0 );
    const double t7 = 0.1e1 + t6;
    const double t8 = t7 * t7;
    const double t9 = t8 * rho;
    const double t10 = b * t7;
    const double t13 = c * t8;
    const double t14 = rho * rho;
    const double t17 = -0.4e1 * t10 * rho + 0.16e2 * t13 * t14 + a;
    const double t18 = 0.1e1 / t17;
    const double t22 = t17 * t17;
    const double t23 = 0.1e1 / t22;
    const double t27 = 0.32e2 * t13 * rho - 0.4e1 * t10;
    const double t32 = piecewise_functor_3( t2, 0.0, t9 * t23 * t27 / 0.4e1 - t8 * t18 / 0.4e1 );


    eps = piecewise_functor_3( t2, 0.0, -t9 * t18 / 0.4e1 );
    vrho = rho * t32 + eps;

  }